

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_parse_data_path(ly_ctx *ctx,char *path,LYD_FORMAT format,uint32_t parse_options,
                          uint32_t validate_options,lyd_node **tree)

{
  ly_in *plStack_48;
  LY_ERR ret__;
  ly_in *in;
  lyd_node **pplStack_38;
  LY_ERR ret;
  lyd_node **tree_local;
  uint32_t local_28;
  uint32_t validate_options_local;
  uint32_t parse_options_local;
  LYD_FORMAT format_local;
  char *path_local;
  ly_ctx *ctx_local;
  
  pplStack_38 = tree;
  tree_local._4_4_ = validate_options;
  local_28 = parse_options;
  validate_options_local = format;
  _parse_options_local = path;
  path_local = (char *)ctx;
  ctx_local._4_4_ = ly_in_new_filepath(path,0,&stack0xffffffffffffffb8);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    in._4_4_ = lyd_parse_data((ly_ctx *)path_local,(lyd_node *)0x0,plStack_48,validate_options_local
                              ,local_28,tree_local._4_4_,pplStack_38);
    ly_in_free(plStack_48,'\0');
    ctx_local._4_4_ = in._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_parse_data_path(const struct ly_ctx *ctx, const char *path, LYD_FORMAT format, uint32_t parse_options,
        uint32_t validate_options, struct lyd_node **tree)
{
    LY_ERR ret;
    struct ly_in *in;

    LY_CHECK_RET(ly_in_new_filepath(path, 0, &in));
    ret = lyd_parse_data(ctx, NULL, in, format, parse_options, validate_options, tree);

    ly_in_free(in, 0);
    return ret;
}